

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetTxInfoByHandle
              (void *handle,void *tx_data_handle,char **txid,char **wtxid,uint32_t *size,
              uint32_t *vsize,uint32_t *weight,uint32_t *version,uint32_t *locktime)

{
  undefined8 uVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  bool *in_RSI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  int32_t *in_stack_00000010;
  uint32_t *in_stack_00000018;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext *tx_1;
  TransactionContext *tx;
  bool is_bitcoin;
  string temp_wtxid;
  string temp_txid;
  uint32_t temp_locktime;
  uint32_t temp_version;
  uint32_t temp_weight;
  uint32_t temp_vsize;
  uint32_t temp_size;
  CfdCapiTransactionData *tx_data;
  char *work_wtxid;
  char *work_txid;
  int result;
  string *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  CfdError error_code;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  bool *is_bitcoin_00;
  string *message;
  ByteData256 local_258;
  Txid local_240;
  string local_220;
  Txid local_200;
  string local_1e0 [24];
  undefined8 in_stack_fffffffffffffe38;
  void *in_stack_fffffffffffffe40;
  AbstractTransaction *this;
  ByteData256 local_1b8;
  Txid local_1a0;
  string local_180;
  Txid local_160;
  string local_140;
  AbstractTransaction *local_120;
  undefined1 local_112;
  allocator local_111;
  string local_110 [39];
  byte local_e9;
  string local_e8 [32];
  string local_c8 [36];
  uint32_t local_a4;
  int32_t local_a0;
  int local_9c;
  int local_98;
  int local_94;
  bool *local_90;
  undefined1 local_81 [49];
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  int *local_38;
  int *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  bool *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  message = (string *)local_81;
  is_bitcoin_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_81 + 1),"TransactionData",(allocator *)message);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffe40,(string *)in_stack_fffffffffffffe38);
  std::__cxx11::string::~string((string *)(local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  local_90 = local_18;
  local_94 = 0;
  local_98 = 0;
  local_9c = 0;
  local_a0 = 0;
  local_a4 = 0;
  std::__cxx11::string::string(local_c8);
  std::__cxx11::string::string(local_e8);
  local_e9 = 0;
  cfd::capi::ConvertNetType((int)((ulong)message >> 0x20),is_bitcoin_00);
  if (*(long *)(local_90 + 0x18) == 0) {
    local_112 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"Invalid handle state. tx is null",&local_111);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               error_code,in_stack_fffffffffffffd40);
    local_112 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_e9 & 1) == 0) {
    this = *(AbstractTransaction **)(local_90 + 0x18);
    cfd::core::AbstractTransaction::GetTxid(&local_200,this);
    cfd::core::Txid::GetHex_abi_cxx11_((string *)local_1e0,&local_200);
    std::__cxx11::string::operator=(local_c8,local_1e0);
    std::__cxx11::string::~string(local_1e0);
    cfd::core::Txid::~Txid((Txid *)0x65eae6);
    cfd::core::AbstractTransaction::GetWitnessHash(&local_258,this);
    cfd::core::Txid::Txid(&local_240,&local_258);
    cfd::core::Txid::GetHex_abi_cxx11_(&local_220,&local_240);
    std::__cxx11::string::operator=(local_e8,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    cfd::core::Txid::~Txid((Txid *)0x65eb5c);
    cfd::core::ByteData256::~ByteData256((ByteData256 *)0x65eb69);
    local_94 = (*this->_vptr_AbstractTransaction[4])();
    local_98 = (*this->_vptr_AbstractTransaction[5])();
    local_9c = (*this->_vptr_AbstractTransaction[6])();
    local_a0 = cfd::core::AbstractTransaction::GetVersion(this);
    local_a4 = cfd::core::AbstractTransaction::GetLockTime(this);
  }
  else {
    local_120 = *(AbstractTransaction **)(local_90 + 0x18);
    cfd::core::AbstractTransaction::GetTxid(&local_160,local_120);
    cfd::core::Txid::GetHex_abi_cxx11_(&local_140,&local_160);
    std::__cxx11::string::operator=(local_c8,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    cfd::core::Txid::~Txid((Txid *)0x65e894);
    cfd::core::AbstractTransaction::GetWitnessHash(&local_1b8,local_120);
    cfd::core::Txid::Txid(&local_1a0,&local_1b8);
    cfd::core::Txid::GetHex_abi_cxx11_(&local_180,&local_1a0);
    std::__cxx11::string::operator=(local_e8,(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    cfd::core::Txid::~Txid((Txid *)0x65e90a);
    cfd::core::ByteData256::~ByteData256((ByteData256 *)0x65e917);
    local_94 = (*local_120->_vptr_AbstractTransaction[4])();
    local_98 = (*local_120->_vptr_AbstractTransaction[5])();
    local_9c = (*local_120->_vptr_AbstractTransaction[6])();
    local_a0 = cfd::core::AbstractTransaction::GetVersion(local_120);
    local_a4 = cfd::core::AbstractTransaction::GetLockTime(local_120);
  }
  if (local_20 != (undefined8 *)0x0) {
    local_48 = cfd::capi::CreateString(message);
  }
  if (local_28 != (undefined8 *)0x0) {
    local_50 = cfd::capi::CreateString(message);
  }
  if (local_30 != (int *)0x0) {
    *local_30 = local_94;
  }
  if (local_38 != (int *)0x0) {
    *local_38 = local_98;
  }
  if (in_stack_00000008 != (int *)0x0) {
    *in_stack_00000008 = local_9c;
  }
  if (in_stack_00000010 != (int32_t *)0x0) {
    *in_stack_00000010 = local_a0;
  }
  if (in_stack_00000018 != (uint32_t *)0x0) {
    *in_stack_00000018 = local_a4;
  }
  if (local_48 != (char *)0x0) {
    *local_20 = local_48;
  }
  if (local_50 != (char *)0x0) {
    *local_28 = local_50;
  }
  local_4 = 0;
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_c8);
  return local_4;
}

Assistant:

int CfdGetTxInfoByHandle(
    void* handle, void* tx_data_handle, char** txid, char** wtxid,
    uint32_t* size, uint32_t* vsize, uint32_t* weight, uint32_t* version,
    uint32_t* locktime) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_txid = nullptr;
  char* work_wtxid = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    uint32_t temp_size = 0;
    uint32_t temp_vsize = 0;
    uint32_t temp_weight = 0;
    uint32_t temp_version = 0;
    uint32_t temp_locktime = 0;
    std::string temp_txid;
    std::string temp_wtxid;
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      temp_txid = tx->GetTxid().GetHex();
      temp_wtxid = Txid(tx->GetWitnessHash()).GetHex();
      temp_size = tx->GetTotalSize();
      temp_vsize = tx->GetVsize();
      temp_weight = tx->GetWeight();
      temp_version = tx->GetVersion();
      temp_locktime = tx->GetLockTime();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      temp_txid = tx->GetTxid().GetHex();
      temp_wtxid = Txid(tx->GetWitnessHash()).GetHex();
      temp_size = tx->GetTotalSize();
      temp_vsize = tx->GetVsize();
      temp_weight = tx->GetWeight();
      temp_version = tx->GetVersion();
      temp_locktime = tx->GetLockTime();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (txid != nullptr) work_txid = CreateString(temp_txid);
    if (wtxid != nullptr) work_wtxid = CreateString(temp_wtxid);
    if (size != nullptr) *size = temp_size;
    if (vsize != nullptr) *vsize = temp_vsize;
    if (weight != nullptr) *weight = temp_weight;
    if (version != nullptr) *version = temp_version;
    if (locktime != nullptr) *locktime = temp_locktime;

    if (work_txid != nullptr) *txid = work_txid;
    if (work_wtxid != nullptr) *wtxid = work_wtxid;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_wtxid);
  return result;
}